

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack30_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x3fffffff;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x1e;
  out[1] = uVar1 >> 0x1e | (uVar2 & 0xfffffff) << 2;
  out[2] = uVar2 >> 0x1c;
  uVar1 = in[2];
  out[2] = uVar2 >> 0x1c | (uVar1 & 0x3ffffff) << 4;
  out[3] = uVar1 >> 0x1a;
  uVar2 = in[3];
  out[3] = uVar1 >> 0x1a | (uVar2 & 0xffffff) << 6;
  uVar1 = in[4];
  out[4] = uVar2 >> 0x18;
  out[4] = uVar2 >> 0x18 | (uVar1 & 0x3fffff) << 8;
  out[5] = uVar1 >> 0x16;
  uVar2 = in[5];
  out[5] = uVar1 >> 0x16 | (uVar2 & 0xfffff) << 10;
  out[6] = uVar2 >> 0x14;
  uVar1 = in[6];
  out[6] = uVar2 >> 0x14 | (uVar1 & 0x3ffff) << 0xc;
  uVar2 = in[7];
  out[7] = uVar1 >> 0x12;
  out[7] = (uVar2 & 0xffff) << 0xe | uVar1 >> 0x12;
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack30_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 28)) << (30 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 26)) << (30 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 24)) << (30 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 22)) << (30 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 20)) << (30 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 18)) << (30 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 16)) << (30 - 16);
  out++;

  return in + 1;
}